

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O0

LibraryImagesLoader * __thiscall
COLLADASaxFWL::RootParser15::
beginCommonWithId<COLLADASaxFWL::LibraryImagesLoader,COLLADASaxFWL::LibraryImagesLoader15>
          (RootParser15 *this,char *id)

{
  LibraryImagesLoader *this_00;
  IParserImpl *parserImpl;
  long in_RDI;
  LibraryImagesLoader15 *loader15;
  LibraryImagesLoader *loader;
  LibraryImagesLoader *in_stack_ffffffffffffff98;
  LibraryImagesLoader *in_stack_ffffffffffffffa0;
  IParserImpl *local_50;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)in_stack_ffffffffffffffa0);
  this_00 = (LibraryImagesLoader *)operator_new(0x28);
  LibraryImagesLoader::LibraryImagesLoader
            (in_stack_ffffffffffffffa0,(IFilePartLoader *)in_stack_ffffffffffffff98);
  parserImpl = (IParserImpl *)operator_new(0x20);
  LibraryImagesLoader15::LibraryImagesLoader15
            ((LibraryImagesLoader15 *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  IFilePartLoader::setParserImpl((IFilePartLoader *)this_00,parserImpl);
  IFilePartLoader::setPartLoader(*(IFilePartLoader **)(in_RDI + 0x20),(IFilePartLoader *)this_00);
  local_50 = (IParserImpl *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    local_50 = parserImpl + 1;
  }
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x50))(*(long **)(in_RDI + 0x20),local_50);
  DocumentProcessor::addToSidTree((DocumentProcessor *)this,id,(char *)loader);
  return this_00;
}

Assistant:

Loader* RootParser15::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}